

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O2

int nn_xsub_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq_data *data;
  char *pcVar1;
  undefined8 uStack_30;
  int rcvprio;
  size_t sz;
  
  sz = 4;
  nn_pipe_getopt(pipe,0,9,&rcvprio,&sz);
  if (sz == 4) {
    if (0xffffffef < rcvprio - 0x11U) {
      data = (nn_fq_data *)nn_alloc_(0x20);
      if (data != (nn_fq_data *)0x0) {
        nn_pipe_setdata(pipe,data);
        nn_fq_add((nn_fq *)(self + 1),data,pipe,rcvprio);
        return 0;
      }
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
              ,0x78);
      goto LAB_0011b552;
    }
    pcVar1 = "rcvprio >= 1 && rcvprio <= 16";
    uStack_30 = 0x75;
  }
  else {
    pcVar1 = "sz == sizeof (rcvprio)";
    uStack_30 = 0x74;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
          ,uStack_30);
LAB_0011b552:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xsub_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsub *xsub;
    struct nn_xsub_data *data;
    int rcvprio;
    size_t sz;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xsub_data), "pipe data (sub)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_fq_add (&xsub->fq, &data->fq, pipe, rcvprio);

    return 0;
}